

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

bool goodform::can_be<unsigned_long>(any *v)

{
  float fVar1;
  bool bVar2;
  char *pcVar3;
  short *psVar4;
  int *piVar5;
  long *plVar6;
  uchar *puVar7;
  unsigned_short *puVar8;
  uint *puVar9;
  unsigned_long *puVar10;
  float *pfVar11;
  double *pdVar12;
  unsigned_long uVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool local_3d;
  float local_38;
  float local_30;
  bool local_29;
  double tmp_1;
  float tmp;
  any *v_local;
  
  bVar2 = is<signed_char>(v);
  if (bVar2) {
    pcVar3 = get<signed_char>(v);
    v_local._7_1_ = detail::can_int_fit_value<unsigned_long,signed_char>(*pcVar3);
  }
  else {
    bVar2 = is<short>(v);
    if (bVar2) {
      psVar4 = get<short>(v);
      v_local._7_1_ = detail::can_int_fit_value<unsigned_long,short>(*psVar4);
    }
    else {
      bVar2 = is<int>(v);
      if (bVar2) {
        piVar5 = get<int>(v);
        v_local._7_1_ = detail::can_int_fit_value<unsigned_long,int>(*piVar5);
      }
      else {
        bVar2 = is<long>(v);
        if (bVar2) {
          plVar6 = get<long>(v);
          v_local._7_1_ = detail::can_int_fit_value<unsigned_long,long>(*plVar6);
        }
        else {
          bVar2 = is<unsigned_char>(v);
          if (bVar2) {
            puVar7 = get<unsigned_char>(v);
            v_local._7_1_ = detail::can_int_fit_value<unsigned_long,unsigned_char>(*puVar7);
          }
          else {
            bVar2 = is<unsigned_short>(v);
            if (bVar2) {
              puVar8 = get<unsigned_short>(v);
              v_local._7_1_ = detail::can_int_fit_value<unsigned_long,unsigned_short>(*puVar8);
            }
            else {
              bVar2 = is<unsigned_int>(v);
              if (bVar2) {
                puVar9 = get<unsigned_int>(v);
                v_local._7_1_ = detail::can_int_fit_value<unsigned_long,unsigned_int>(*puVar9);
              }
              else {
                bVar2 = is<unsigned_long>(v);
                if (bVar2) {
                  puVar10 = get<unsigned_long>(v);
                  v_local._7_1_ = detail::can_int_fit_value<unsigned_long,unsigned_long>(*puVar10);
                }
                else {
                  bVar2 = is<float>(v);
                  if (bVar2) {
                    pfVar11 = get<float>(v);
                    fVar1 = *pfVar11;
                    dVar14 = std::floor((double)(ulong)(uint)fVar1);
                    local_29 = false;
                    if (SUB84(dVar14,0) == fVar1) {
                      uVar13 = std::numeric_limits<unsigned_long>::max();
                      local_30 = (float)uVar13;
                      local_29 = false;
                      if (fVar1 <= local_30) {
                        uVar13 = std::numeric_limits<unsigned_long>::min();
                        local_38 = (float)uVar13;
                        local_29 = local_38 <= fVar1;
                      }
                    }
                    v_local._7_1_ = local_29;
                  }
                  else {
                    bVar2 = is<double>(v);
                    if (bVar2) {
                      pdVar12 = get<double>(v);
                      dVar14 = *pdVar12;
                      dVar15 = floor(dVar14);
                      local_3d = false;
                      if (dVar15 == dVar14) {
                        uVar13 = std::numeric_limits<unsigned_long>::max();
                        auVar16._8_4_ = (int)(uVar13 >> 0x20);
                        auVar16._0_8_ = uVar13;
                        auVar16._12_4_ = 0x45300000;
                        local_3d = false;
                        if (dVar14 <= (auVar16._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0
                                      )) {
                          uVar13 = std::numeric_limits<unsigned_long>::min();
                          auVar17._8_4_ = (int)(uVar13 >> 0x20);
                          auVar17._0_8_ = uVar13;
                          auVar17._12_4_ = 0x45300000;
                          local_3d = (auVar17._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)
                                     <= dVar14;
                        }
                      }
                      v_local._7_1_ = local_3d;
                    }
                    else {
                      v_local._7_1_ = is<unsigned_long>(v);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return v_local._7_1_;
}

Assistant:

bool can_be(const any& v)
  {
    if (std::is_integral<T>::value)
    {
      if (is<std::int8_t>(v)) return detail::can_int_fit_value<T>(get<std::int8_t>(v));
      if (is<std::int16_t>(v)) return detail::can_int_fit_value<T>(get<std::int16_t>(v));
      if (is<std::int32_t>(v)) return detail::can_int_fit_value<T>(get<std::int32_t>(v));
      if (is<std::int64_t>(v)) return detail::can_int_fit_value<T>(get<std::int64_t>(v));
      if (is<std::uint8_t>(v)) return detail::can_int_fit_value<T>(get<std::uint8_t>(v));
      if (is<std::uint16_t>(v)) return detail::can_int_fit_value<T>(get<std::uint16_t>(v));
      if (is<std::uint32_t>(v)) return detail::can_int_fit_value<T>(get<std::uint32_t>(v));
      if (is<std::uint64_t>(v)) return detail::can_int_fit_value<T>(get<std::uint64_t>(v));
      if (is<float>(v))
      {
        float tmp = get<float>(v);
        return std::floor(tmp) == tmp && float(std::numeric_limits<T>::max()) >= tmp && float(std::numeric_limits<T>::min()) <= tmp;
      }
      if (is<double>(v))
      {
        double tmp = get<double>(v);
        return std::floor(tmp) == tmp && double(std::numeric_limits<T>::max()) >= tmp && double(std::numeric_limits<T>::min()) <= tmp;
      }
    }
    else if (std::is_same<T, double>::value)
    {
      return true;
    }
    else if (std::is_same<T, float>::value)
    {
      if (!is<double>(v))
        return true;
      else
      {
        float tmp = float(get<double>(v));
        if (double(tmp) == get<double>(v))
          return true;
      }
    }
    return is<T>(v);
  }